

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

int __thiscall Jupiter::HTTP::Server::bind(Server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Data *pDVar1;
  uint uVar2;
  pointer pTVar3;
  char *pcVar4;
  Socket *this_00;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> local_78 [3];
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  unique_ptr<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_> local_38;
  __single_object socket;
  uint16_t port_local;
  Server *this_local;
  string_view hostname_local;
  
  this_local = (Server *)CONCAT44(in_register_00000034,__fd);
  socket._M_t.super___uniq_ptr_impl<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>.
  _M_t.super__Tuple_impl<0UL,_Jupiter::TCPSocket_*,_std::default_delete<Jupiter::TCPSocket>_>.
  super__Head_base<0UL,_Jupiter::TCPSocket_*,_false>._M_head_impl._6_2_ = (ushort)__len;
  hostname_local._M_len = (size_t)__addr;
  std::make_unique<Jupiter::TCPSocket>();
  pTVar3 = std::unique_ptr<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>::operator->
                     (&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_58,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_59);
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_58);
  uVar2 = (*(pTVar3->super_Socket)._vptr_Socket[2])
                    (pTVar3,pcVar4,
                     (ulong)socket._M_t.
                            super___uniq_ptr_impl<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Jupiter::TCPSocket_*,_std::default_delete<Jupiter::TCPSocket>_>
                            .super__Head_base<0UL,_Jupiter::TCPSocket_*,_false>._M_head_impl._6_2_,1
                    );
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  hostname_local._M_str._7_1_ = (uVar2 & 1) != 0;
  if ((bool)hostname_local._M_str._7_1_) {
    this_00 = &std::unique_ptr<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>::
               operator->(&local_38)->super_Socket;
    Socket::setBlocking(this_00,false);
    pDVar1 = this->m_data;
    std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>::
    unique_ptr<Jupiter::TCPSocket,std::default_delete<Jupiter::TCPSocket>,void>
              ((unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>> *)local_78,
               &local_38);
    std::
    vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
    ::push_back(&pDVar1->m_ports,(value_type *)local_78);
    std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::~unique_ptr(local_78);
  }
  std::unique_ptr<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>::~unique_ptr
            (&local_38);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),hostname_local._M_str._7_1_) & 0xffffff01;
}

Assistant:

bool Jupiter::HTTP::Server::bind(std::string_view hostname, uint16_t port) {
	auto socket = std::make_unique<Jupiter::TCPSocket>();
	if (socket->bind(static_cast<std::string>(hostname).c_str(), port, true)) {
		socket->setBlocking(false);
		m_data->m_ports.push_back(std::move(socket));
		return true;
	}

	return false;
}